

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

ExceptionOr<kj::Promise<kj::AutoCloseFd>_> * __thiscall
kj::_::ExceptionOr<kj::Promise<kj::AutoCloseFd>_>::operator=
          (ExceptionOr<kj::Promise<kj::AutoCloseFd>_> *this,
          ExceptionOr<kj::Promise<kj::AutoCloseFd>_> *param_1)

{
  NullableValue<kj::Exception>::operator=
            ((NullableValue<kj::Exception> *)this,(NullableValue<kj::Exception> *)param_1);
  NullableValue<kj::Promise<kj::AutoCloseFd>_>::operator=(&(this->value).ptr,&(param_1->value).ptr);
  return this;
}

Assistant:

ExceptionOr& operator=(ExceptionOr&&) = default;